

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockTests.cpp
# Opt level: O2

void deqp::createRandomCaseGroup
               (TestCaseGroup *parentGroup,Context *context,char *groupName,char *description,
               GLSLVersion glslVersion,BufferMode bufferMode,deUint32 features,int numCases,
               deUint32 baseSeed)

{
  int iVar1;
  uint uVar2;
  TestNode *node;
  RandomUniformBlockCase *this;
  int local_5c;
  GLSLVersion local_58;
  BufferMode local_54;
  string local_50;
  
  local_58 = glslVersion;
  local_54 = bufferMode;
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)node,context->m_testCtx,groupName,description);
  tcu::TestNode::addChild(&parentGroup->super_TestNode,node);
  iVar1 = tcu::CommandLine::getBaseSeed(context->m_testCtx->m_cmdLine);
  for (local_5c = 0; local_5c < numCases; local_5c = local_5c + 1) {
    this = (RandomUniformBlockCase *)operator_new(0xe8);
    de::toString<int>(&local_50,&local_5c);
    uVar2 = local_5c + iVar1 + baseSeed;
    uVar2 = (uVar2 >> 0x10 ^ uVar2 ^ 0x3d) * 9;
    uVar2 = (uVar2 >> 4 ^ uVar2) * 0x27d4eb2d;
    RandomUniformBlockCase::RandomUniformBlockCase
              (this,context,local_50._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1,
               local_58,local_54,features,uVar2 >> 0xf ^ uVar2);
    tcu::TestNode::addChild(node,(TestNode *)this);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

static void createRandomCaseGroup(tcu::TestCaseGroup* parentGroup, Context& context, const char* groupName,
								  const char* description, glu::GLSLVersion glslVersion,
								  UniformBlockCase::BufferMode bufferMode, deUint32 features, int numCases,
								  deUint32 baseSeed)
{
	tcu::TestCaseGroup* group = new tcu::TestCaseGroup(context.getTestContext(), groupName, description);
	parentGroup->addChild(group);

	baseSeed += (deUint32)context.getTestContext().getCommandLine().getBaseSeed();

	for (int ndx = 0; ndx < numCases; ndx++)
		group->addChild(new RandomUniformBlockCase(context, de::toString(ndx).c_str(), "", glslVersion, bufferMode,
												   features, (deUint32)deInt32Hash(ndx + baseSeed)));
}